

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_flatteningMediumBondGraph_Test::TestBody
          (ModelFlattening_flatteningMediumBondGraph_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_250 [8];
  Message local_248 [8];
  shared_ptr<libcellml::Component> local_240;
  shared_ptr<libcellml::Variable> local_230;
  unsigned_long local_220 [2];
  undefined1 local_210 [8];
  AssertionResult gtest_ar_3;
  Message local_1f8 [8];
  shared_ptr<libcellml::Component> local_1f0;
  shared_ptr<libcellml::Variable> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  Message local_198 [8];
  shared_ptr<libcellml::Component> local_190;
  shared_ptr<libcellml::Variable> local_180;
  unsigned_long local_170 [2];
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  Message local_148 [8];
  shared_ptr<libcellml::Component> local_140;
  shared_ptr<libcellml::Variable> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  ModelPtr flatModel;
  string local_d8 [32];
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  undefined1 local_40 [8];
  ModelPtr model;
  ParserPtr parser;
  ImporterPtr importer;
  ModelFlattening_flatteningMediumBondGraph_Test *this_local;
  
  libcellml::Importer::create((bool)((char)&parser + '\b'));
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"importer/mediumbondgraph/cpp_coupling.cellml",&local_81);
  fileContents(local_60);
  libcellml::Parser::parseModel((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"importer/mediumbondgraph",
             (allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  resourcePath(local_b8);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_40);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_140);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_140);
  libcellml::Component::variable((ulong)&local_130);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_130);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[14],std::__cxx11::string>
            ((EqHelper<false> *)local_100,"\"C_main_vessel\"",
             "flatModel->component(0)->variable(0)->name()",(char (*) [14])"C_main_vessel",
             &local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_130);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6ee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_170[1] = 1;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_190);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_190);
  libcellml::Component::variable((ulong)&local_180);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_180);
  local_170[0] = libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_160,"size_t(1)",
             "flatModel->component(0)->variable(0)->equivalentVariableCount()",local_170 + 1,
             local_170);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_180);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_1f0);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1f0);
  libcellml::Component::variable((ulong)&local_1e0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1e0);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_1b0,"\"C\"","flatModel->component(2)->variable(1)->name()",
             (char (*) [2])"C",&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1e0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6f0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_220[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ComponentEntity::component((ulong)&local_240);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_240);
  libcellml::Component::variable((ulong)&local_230);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_230);
  local_220[0] = libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_210,"size_t(2)",
             "flatModel->component(2)->variable(1)->equivalentVariableCount()",local_220 + 1,
             local_220);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_230);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x6f1,pcVar3);
    testing::internal::AssertHelper::operator=(local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(local_250);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningMediumBondGraph)
{
    auto importer = libcellml::Importer::create(false);
    auto parser = libcellml::Parser::create(false);

    auto model = parser->parseModel(fileContents("importer/mediumbondgraph/cpp_coupling.cellml"));
    importer->resolveImports(model, resourcePath("importer/mediumbondgraph"));

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ("C_main_vessel", flatModel->component(0)->variable(0)->name());
    EXPECT_EQ(size_t(1), flatModel->component(0)->variable(0)->equivalentVariableCount());
    EXPECT_EQ("C", flatModel->component(2)->variable(1)->name());
    EXPECT_EQ(size_t(2), flatModel->component(2)->variable(1)->equivalentVariableCount());
}